

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStatePdu.cpp
# Opt level: O0

void __thiscall DIS::EntityStatePdu::marshal(EntityStatePdu *this,DataStream *dataStream)

{
  double dVar1;
  size_type sVar2;
  double dVar3;
  const_reference pvVar4;
  undefined1 local_38 [8];
  ArticulationParameter x;
  size_t idx;
  DataStream *dataStream_local;
  EntityStatePdu *this_local;
  
  EntityInformationFamilyPdu::marshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::marshal(&this->_entityID,dataStream);
  DataStream::operator<<(dataStream,this->_forceId);
  sVar2 = std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::size
                    (&this->_articulationParameters);
  DataStream::operator<<(dataStream,(char)sVar2);
  EntityType::marshal(&this->_entityType,dataStream);
  EntityType::marshal(&this->_alternativeEntityType,dataStream);
  Vector3Float::marshal(&this->_entityLinearVelocity,dataStream);
  Vector3Double::marshal(&this->_entityLocation,dataStream);
  Orientation::marshal(&this->_entityOrientation,dataStream);
  DataStream::operator<<(dataStream,this->_entityAppearance);
  DeadReckoningParameter::marshal(&this->_deadReckoningParameters,dataStream);
  Marking::marshal(&this->_marking,dataStream);
  DataStream::operator<<(dataStream,this->_capabilities);
  x._parameterValue = 0.0;
  while( true ) {
    dVar1 = x._parameterValue;
    dVar3 = (double)std::
                    vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                    ::size(&this->_articulationParameters);
    if ((ulong)dVar3 <= (ulong)dVar1) break;
    pvVar4 = std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::
             operator[](&this->_articulationParameters,(size_type)x._parameterValue);
    ArticulationParameter::ArticulationParameter((ArticulationParameter *)local_38,pvVar4);
    ArticulationParameter::marshal((ArticulationParameter *)local_38,dataStream);
    ArticulationParameter::~ArticulationParameter((ArticulationParameter *)local_38);
    x._parameterValue = (double)((long)x._parameterValue + 1);
  }
  return;
}

Assistant:

void EntityStatePdu::marshal(DataStream& dataStream) const
{
    EntityInformationFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _entityID.marshal(dataStream);
    dataStream << _forceId;
    dataStream << ( char )_articulationParameters.size();
    _entityType.marshal(dataStream);
    _alternativeEntityType.marshal(dataStream);
    _entityLinearVelocity.marshal(dataStream);
    _entityLocation.marshal(dataStream);
    _entityOrientation.marshal(dataStream);
    dataStream << _entityAppearance;
    _deadReckoningParameters.marshal(dataStream);
    _marking.marshal(dataStream);
    dataStream << _capabilities;

     for(size_t idx = 0; idx < _articulationParameters.size(); idx++)
     {
        ArticulationParameter x = _articulationParameters[idx];
        x.marshal(dataStream);
     }

}